

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O3

exception exception_create(char *message,char *label,int64_t code,char *stacktrace)

{
  exception peVar1;
  uint64_t uVar2;
  
  peVar1 = (exception)malloc(0x30);
  if (peVar1 != (exception)0x0) {
    peVar1->message = message;
    peVar1->label = label;
    peVar1->code = code;
    peVar1->stacktrace = stacktrace;
    uVar2 = thread_id_get_current();
    peVar1->id = uVar2;
    LOCK();
    (peVar1->ref).count = 0;
    UNLOCK();
    LOCK();
    exception_stats.allocations = exception_stats.allocations + 1;
    UNLOCK();
  }
  return peVar1;
}

Assistant:

exception exception_create(char *message, char *label, int64_t code, char *stacktrace)
{
	exception ex = malloc(sizeof(struct exception_type));

	if (ex == NULL)
	{
		return NULL;
	}

	ex->message = message;
	ex->label = label;
	ex->code = code;
	ex->stacktrace = stacktrace;
	ex->id = thread_id_get_current();

	threading_atomic_ref_count_initialize(&ex->ref);

	reflect_memory_tracker_allocation(exception_stats);

	return ex;
}